

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

Vec_Ptr_t * Gia_GetFakeNames(int nNames)

{
  Vec_Ptr_t *p;
  char *Entry;
  int local_24;
  char local_1d;
  int i;
  Vec_Ptr_t *pVStack_18;
  char Buffer [5];
  Vec_Ptr_t *vNames;
  int nNames_local;
  
  pVStack_18 = Vec_PtrAlloc(nNames);
  for (local_24 = 0; p = pVStack_18, local_24 < nNames; local_24 = local_24 + 1) {
    if (nNames < 0x1a) {
      local_1d = (char)local_24;
      i._0_1_ = '\0';
    }
    else {
      local_1d = (char)(local_24 % 0x1a);
      i._0_1_ = (char)(local_24 / 0x1a) + '0';
      i._1_1_ = 0;
    }
    local_1d = local_1d + 'a';
    Entry = Extra_UtilStrsav(&local_1d);
    Vec_PtrPush(p,Entry);
  }
  return pVStack_18;
}

Assistant:

Vec_Ptr_t * Gia_GetFakeNames( int nNames )
{
    Vec_Ptr_t * vNames;
    char Buffer[5];
    int i;

    vNames = Vec_PtrAlloc( nNames );
    for ( i = 0; i < nNames; i++ )
    {
        if ( nNames < 26 )
        {
            Buffer[0] = 'a' + i;
            Buffer[1] = 0;
        }
        else
        {
            Buffer[0] = 'a' + i%26;
            Buffer[1] = '0' + i/26;
            Buffer[2] = 0;
        }
        Vec_PtrPush( vNames, Extra_UtilStrsav(Buffer) );
    }
    return vNames;
}